

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_korax.cpp
# Opt level: O2

int AF_A_KoraxCommand(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  int iVar2;
  DObject *this;
  bool bVar3;
  int iVar4;
  int iVar5;
  AActor *ent;
  char *__assertion;
  FName local_48;
  FSoundID local_44;
  DAngle local_40;
  DVector3 pos;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053ff2d;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (AActor *)0x0) {
LAB_0053fdc1:
        ent = (AActor *)0x0;
      }
      else {
        bVar3 = DObject::IsKindOf((DObject *)ent,AActor::RegistrationInfo.MyClass);
        if (!bVar3) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053ff2d;
        }
      }
      if (numparam == 1) goto LAB_0053fe41;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053ff1d;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar3 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar3) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053ff2d;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053ff1d;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053fe41:
        local_44.ID = S_FindSound("KoraxCommand");
        S_Sound(ent,2,&local_44,1.0,1.0);
        local_40.Degrees = (ent->Angles).Yaw.Degrees + -90.0;
        AActor::Vec3Angle(&pos,ent,27.0,&local_40,120.0,false);
        FName::FName(&local_48,"KoraxBolt");
        Spawn(&local_48,&pos,ALLOW_REPLACE);
        iVar2 = ent->health;
        iVar4 = AActor::SpawnHealth(ent);
        iVar5 = FRandom::operator()(&pr_koraxcommand);
        P_StartScript(ent,(line_t *)0x0,iVar5 % (int)(iVar4 >> 1 < iVar2 ^ 5) + 0xfa,(char *)0x0,
                      (int *)0x0,0,0);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053ff2d;
    }
    if (ent == (AActor *)0x0) goto LAB_0053fdc1;
  }
LAB_0053ff1d:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053ff2d:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_korax.cpp"
                ,0x10c,"int AF_A_KoraxCommand(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_KoraxCommand)
{
	PARAM_ACTION_PROLOGUE;
	DAngle ang;
	int numcommands;

	S_Sound (self, CHAN_VOICE, "KoraxCommand", 1, ATTN_NORM);

	// Shoot stream of lightning to ceiling
	ang = self->Angles.Yaw - 90;
	DVector3 pos = self->Vec3Angle(KORAX_COMMAND_OFFSET, ang, KORAX_COMMAND_HEIGHT);
	Spawn("KoraxBolt", pos, ALLOW_REPLACE);

	if (self->health <= (self->SpawnHealth() >> 1))
	{
		numcommands = 5;
	}
	else
	{
		numcommands = 4;
	}

	P_StartScript (self, NULL, 250+(pr_koraxcommand()%numcommands), NULL, NULL, 0, 0);
	return 0;
}